

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add(nk_font_atlas *atlas,nk_font_config *config)

{
  nk_font_config *dst0;
  void *pvVar1;
  nk_font_config *cfg;
  nk_font *font;
  nk_font_config *config_local;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a4b,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a4c,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a4d,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a4e,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a4f,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config == (nk_font_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a51,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_blob == (void *)0x0) {
    __assert_fail("config->ttf_blob",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2a52,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_size != 0) {
    if (config->size <= 0.0) {
      __assert_fail("config->size > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2a54,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    if ((((((atlas == (nk_font_atlas *)0x0) || (config == (nk_font_config *)0x0)) ||
          (config->ttf_blob == (void *)0x0)) || ((config->ttf_size == 0 || (config->size <= 0.0))))
        || (((atlas->permanent).alloc == (nk_plugin_alloc)0x0 ||
            (((atlas->permanent).free == (nk_plugin_free)0x0 ||
             ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)))))) ||
       ((atlas->temporary).free == (nk_plugin_free)0x0)) {
      atlas_local = (nk_font_atlas *)0x0;
    }
    else {
      dst0 = (nk_font_config *)
             (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x48);
      nk_memcopy(dst0,config,0x48);
      if (atlas->config == (nk_font_config *)0x0) {
        atlas->config = dst0;
        dst0->next = (nk_font_config *)0x0;
      }
      else {
        dst0->next = atlas->config;
        atlas->config = dst0;
      }
      if (config->merge_mode == '\0') {
        cfg = (nk_font_config *)
              (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x80);
        if (cfg == (nk_font_config *)0x0) {
          __assert_fail("font",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2a6b,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        if (cfg == (nk_font_config *)0x0) {
          return (nk_font *)0x0;
        }
        cfg[1].range = (nk_rune *)dst0;
      }
      else {
        if (atlas->font_num == 0) {
          __assert_fail("atlas->font_num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2a6f,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        cfg = (nk_font_config *)atlas->fonts;
        ((nk_font *)cfg)->config = dst0;
      }
      if (config->merge_mode == '\0') {
        if (atlas->fonts == (nk_font *)0x0) {
          atlas->fonts = (nk_font *)cfg;
          cfg->next = (nk_font_config *)0x0;
        }
        else {
          cfg->next = (nk_font_config *)atlas->fonts;
          atlas->fonts = (nk_font *)cfg;
        }
        dst0->font = (nk_baked_font *)&cfg->range;
      }
      if (config->ttf_data_owned_by_atlas == '\0') {
        pvVar1 = (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,dst0->ttf_size)
        ;
        dst0->ttf_blob = pvVar1;
        if (dst0->ttf_blob == (void *)0x0) {
          __assert_fail("cfg->ttf_blob",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2a83,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        if (dst0->ttf_blob == (void *)0x0) {
          atlas->font_num = atlas->font_num + 1;
          return (nk_font *)0x0;
        }
        nk_memcopy(dst0->ttf_blob,config->ttf_blob,dst0->ttf_size);
        dst0->ttf_data_owned_by_atlas = '\x01';
      }
      atlas->font_num = atlas->font_num + 1;
      atlas_local = (nk_font_atlas *)cfg;
    }
    return (nk_font *)atlas_local;
  }
  __assert_fail("config->ttf_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x2a53,
                "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add(struct nk_font_atlas *atlas, const struct nk_font_config *config)
{
    struct nk_font *font = 0;
    struct nk_font_config *cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);

    NK_ASSERT(config);
    NK_ASSERT(config->ttf_blob);
    NK_ASSERT(config->ttf_size);
    NK_ASSERT(config->size > 0.0f);

    if (!atlas || !config || !config->ttf_blob || !config->ttf_size || config->size <= 0.0f||
        !atlas->permanent.alloc || !atlas->permanent.free ||
        !atlas->temporary.alloc || !atlas->temporary.free)
        return 0;

    /* allocate and insert font config into list */
    cfg = (struct nk_font_config*)
        atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font_config));
    NK_MEMCPY(cfg, config, sizeof(*config));
    if (!atlas->config) {
        atlas->config = cfg;
        cfg->next = 0;
    } else {
        cfg->next = atlas->config;
        atlas->config = cfg;
    }

    /* allocate new font */
    if (!config->merge_mode) {
        font = (struct nk_font*)
            atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font));
        NK_ASSERT(font);
        if (!font) return 0;
        font->config = cfg;
    } else {
        NK_ASSERT(atlas->font_num);
        font = atlas->fonts;
        font->config = cfg;
    }

    /* insert font into list */
    if (!config->merge_mode) {
        if (!atlas->fonts) {
            atlas->fonts = font;
            font->next = 0;
        } else {
            font->next = atlas->fonts;
            atlas->fonts = font;
        }
        cfg->font = &font->info;
    }

    /* create own copy of .TTF font blob */
    if (!config->ttf_data_owned_by_atlas) {
        cfg->ttf_blob = atlas->permanent.alloc(atlas->permanent.userdata,0, cfg->ttf_size);
        NK_ASSERT(cfg->ttf_blob);
        if (!cfg->ttf_blob) {
            atlas->font_num++;
            return 0;
        }
        NK_MEMCPY(cfg->ttf_blob, config->ttf_blob, cfg->ttf_size);
        cfg->ttf_data_owned_by_atlas = 1;
    }
    atlas->font_num++;
    return font;
}